

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::bootstrap::Bootstrap::bind_function(Bootstrap *this,Function_Params *params)

{
  arity_error *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  allocator_type local_61;
  Const_Proxy_Function f;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_50;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_38;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_28;
  
  if (params->m_begin == params->m_end) {
    paVar1 = (arity_error *)__cxa_allocate_exception(0x18);
    exception::arity_error::arity_error(paVar1,0,1);
    __cxa_throw(paVar1,&exception::arity_error::typeinfo,std::range_error::~range_error);
  }
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
            ((chaiscript *)&f,params->m_begin,(Type_Conversions_State *)0x0);
  if (((long)(f.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_arity != -1) &&
     (((long)params->m_end - (long)params->m_begin >> 4) + -1 !=
      (long)(f.
             super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_arity)) {
    paVar1 = (arity_error *)__cxa_allocate_exception(0x18);
    exception::arity_error::arity_error
              (paVar1,(int)((ulong)((long)params->m_end - (long)params->m_begin) >> 4),
               (f.
                super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->m_arity);
    __cxa_throw(paVar1,&exception::arity_error::typeinfo,std::range_error::~range_error);
  }
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  vector<chaiscript::Boxed_Value_const*,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_50,
             params->m_begin + 1,params->m_end,&local_61);
  std::
  make_shared<chaiscript::dispatch::Bound_Function,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (&local_38,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)&f);
  local_28.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_38.
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_28.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_38.
       super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_38.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_38.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
            ((Object_Data *)this,&local_28,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_50)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value bind_function(const Function_Params &params) {
      if (params.empty()) {
        throw exception::arity_error(0, 1);
      }

      Const_Proxy_Function f = boxed_cast<Const_Proxy_Function>(params[0]);

      if (f->get_arity() != -1 && size_t(f->get_arity()) != params.size() - 1) {
        throw exception::arity_error(static_cast<int>(params.size()), f->get_arity());
      }

      return Boxed_Value(Const_Proxy_Function(
          std::make_shared<dispatch::Bound_Function>(std::move(f), std::vector<Boxed_Value>(params.begin() + 1, params.end()))));
    }